

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::detail::arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler>::
write_decimal<unsigned_long_long>
          (arg_formatter_base<fmt::v6::buffer_range<char>,_fmt::v6::detail::error_handler> *this,
          unsigned_long_long value)

{
  int iVar1;
  checked_ptr<typename_buffer<char>::value_type> pcVar2;
  
  iVar1 = count_digits(value);
  pcVar2 = reserve(this,(long)iVar1);
  format_decimal<char,unsigned_long,char*,fmt::v6::detail::format_decimal<char,char*,unsigned_long>(char*,unsigned_long,int)::_lambda(char*)_1_>
            (pcVar2,value,iVar1);
  return;
}

Assistant:

void write_decimal(Int value) {
    auto abs_value = static_cast<uint32_or_64_or_128_t<Int>>(value);
    bool negative = is_negative(value);
    // Don't do -abs_value since it trips unsigned-integer-overflow sanitizer.
    if (negative) abs_value = ~abs_value + 1;
    int num_digits = count_digits(abs_value);
    auto&& it = reserve((negative ? 1 : 0) + static_cast<size_t>(num_digits));
    if (negative) *it++ = static_cast<char_type>('-');
    it = format_decimal<char_type>(it, abs_value, num_digits);
  }